

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

bool __thiscall pbrt::DisplayItem::Display(DisplayItem *this,IPCChannel *ipcChannel)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  pointer pIVar5;
  int iVar6;
  long lVar7;
  function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *pfVar8;
  int c;
  ulong uVar9;
  function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *pfVar10;
  long lVar11;
  pointer pIVar12;
  int tileIndex;
  uint uVar13;
  int c_1;
  ulong uVar14;
  Bounds2<int> __args;
  span<pstd::span<float>_> __args_1;
  allocator_type local_5d;
  uint local_5c;
  undefined4 local_58;
  uint local_54;
  function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *local_50;
  vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_> displayValues;
  
  if (this->openedImage == false) {
    bVar4 = SendOpenImage(this,ipcChannel);
    if (!bVar4) {
      local_58 = 0;
      goto LAB_002eb3df;
    }
    this->openedImage = true;
  }
  std::vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_>::vector
            (&displayValues,
             (long)(this->channelBuffers).
                   super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->channelBuffers).
                   super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,&local_5d);
  lVar7 = 0;
  uVar9 = 0;
  while( true ) {
    pIVar5 = (this->channelBuffers).
             super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pIVar12 = (this->channelBuffers).
              super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)pIVar5 - (long)pIVar12 >> 6) <= uVar9) break;
    uVar9 = uVar9 + 1;
    *(long *)((long)&(displayValues.
                      super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->ptr + lVar7) =
         (long)(&pIVar12->channelValuesOffset)[lVar7] +
         *(long *)((long)&(pIVar12->buffer).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + lVar7 * 4);
    *(undefined8 *)
     ((long)&(displayValues.
              super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>._M_impl.
              super__Vector_impl_data._M_start)->n + lVar7) = 0x4000;
    lVar7 = lVar7 + 0x10;
  }
  pfVar8 = &this->getTileValues;
  tileIndex = 0;
  uVar2 = 0;
  local_50 = pfVar8;
  while (uVar13 = uVar2, iVar6 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y,
        local_58 = (undefined4)CONCAT71((int7)((ulong)pfVar8 >> 8),iVar6 <= (int)uVar13),
        (int)uVar13 < iVar6) {
    local_5c = uVar13 + 0x80;
    pfVar8 = (function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)0x0;
    while( true ) {
      uVar1 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
      iVar6 = (int)pfVar8;
      uVar2 = local_5c;
      if ((int)uVar1 <= iVar6) break;
      uVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      local_54 = iVar6 + 0x80;
      if ((int)local_5c <= (int)uVar2) {
        uVar2 = local_5c;
      }
      uVar9 = (ulong)uVar2;
      if ((int)local_54 <= (int)uVar1) {
        uVar1 = local_54;
      }
      lVar7 = 0;
      for (uVar14 = 0; uVar14 < (ulong)((long)pIVar5 - (long)pIVar12 >> 6); uVar14 = uVar14 + 1) {
        lVar3 = *(long *)((long)&(pIVar12->buffer).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl + lVar7);
        lVar11 = (long)*(int *)((long)&pIVar12->tileBoundsOffset + lVar7);
        *(int *)(lVar3 + lVar11) = iVar6;
        *(uint *)(lVar3 + 4 + lVar11) = uVar13;
        *(uint *)(lVar3 + 8 + lVar11) = uVar1 - iVar6;
        *(uint *)(lVar3 + 0xc + lVar11) = uVar2 - uVar13;
        *(uint *)((long)&pIVar12->setCount + lVar7) = (uVar2 - uVar13) * (uVar1 - iVar6);
        lVar7 = lVar7 + 0x40;
        pIVar12 = (this->channelBuffers).
                  super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar5 = (this->channelBuffers).
                 super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pfVar10 = pfVar8;
      if ((int)uVar1 < iVar6) {
        pfVar10 = (function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)
                  (ulong)uVar1;
      }
      uVar14 = (ulong)uVar13;
      if ((int)uVar2 < (int)uVar13) {
        uVar14 = uVar9;
      }
      __args.pMin.super_Tuple2<pbrt::Point2,_int> =
           (Tuple2<pbrt::Point2,_int>)((ulong)pfVar10 | uVar14 << 0x20);
      pfVar10 = (function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)(ulong)uVar1;
      if ((int)uVar1 < iVar6) {
        pfVar10 = pfVar8;
      }
      if ((int)uVar2 < (int)uVar13) {
        uVar9 = (ulong)uVar13;
      }
      __args.pMax.super_Tuple2<pbrt::Point2,_int> =
           (Tuple2<pbrt::Point2,_int>)((ulong)pfVar10 | uVar9 << 0x20);
      __args_1.n = (long)displayValues.
                         super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)displayValues.
                         super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4;
      __args_1.ptr = displayValues.
                     super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      std::function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)>::operator()
                (local_50,__args,__args_1);
      lVar7 = 0;
      uVar9 = 0xffffffffffffffff;
      while( true ) {
        pIVar5 = (this->channelBuffers).
                 super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pIVar12 = (this->channelBuffers).
                  super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar9 = uVar9 + 1;
        if ((ulong)((long)pIVar5 - (long)pIVar12 >> 6) <= uVar9) break;
        bVar4 = ImageChannelBuffer::SendIfChanged
                          ((ImageChannelBuffer *)
                           ((long)&(pIVar12->buffer).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl + lVar7),ipcChannel,tileIndex);
        lVar7 = lVar7 + 0x40;
        if (!bVar4) {
          this->openedImage = false;
          goto LAB_002eb3cd;
        }
      }
      pfVar8 = (function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)
               (ulong)local_54;
      tileIndex = tileIndex + 1;
    }
  }
LAB_002eb3cd:
  std::_Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>::~_Vector_base
            (&displayValues.
              super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>);
LAB_002eb3df:
  return SUB41(local_58,0);
}

Assistant:

bool DisplayItem::Display(IPCChannel &ipcChannel) {
    if (!openedImage) {
        if (!SendOpenImage(ipcChannel))
            // maybe next time
            return false;
        openedImage = true;
    }

    std::vector<pstd::span<Float>> displayValues(channelBuffers.size());
    for (int c = 0; c < channelBuffers.size(); ++c) {
        Float *ptr = (Float *)(channelBuffers[c].buffer.data() +
                               channelBuffers[c].channelValuesOffset);
        displayValues[c] = pstd::MakeSpan(ptr, tileSize * tileSize);
    }

    int tileIndex = 0;
    for (int y = 0; y < resolution.y; y += tileSize)
        for (int x = 0; x < resolution.x; x += tileSize, ++tileIndex) {
            int height = std::min(y + tileSize, resolution.y) - y;
            int width = std::min(x + tileSize, resolution.x) - x;

            for (int c = 0; c < channelBuffers.size(); ++c)
                channelBuffers[c].SetTileBounds(x, y, width, height);

            Bounds2i b(Point2i(x, y), Point2i(x + width, y + height));
            getTileValues(b, pstd::MakeSpan(displayValues));

            // Send the RGB buffers only if they're different than
            // the last version sent.
            for (int c = 0; c < channelBuffers.size(); ++c)
                if (!channelBuffers[c].SendIfChanged(ipcChannel, tileIndex)) {
                    // Welp. Stop for now...
                    openedImage = false;
                    return false;
                }
        }

    return true;
}